

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void fail_if_blocks_allocated(ListNode *check_point,char *test_name)

{
  size_t sVar1;
  undefined8 in_RSI;
  size_t allocated_blocks;
  
  sVar1 = display_allocated_blocks((ListNode *)allocated_blocks);
  if (sVar1 != 0) {
    free_allocated_blocks((ListNode *)allocated_blocks);
    cm_print_error("ERROR: %s leaked %zu block(s)\n",in_RSI,sVar1);
    exit_test((int)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

static void fail_if_blocks_allocated(const ListNode * const check_point,
                                     const char * const test_name) {
    const size_t allocated_blocks = display_allocated_blocks(check_point);
    if (allocated_blocks > 0) {
        free_allocated_blocks(check_point);
        cm_print_error("ERROR: %s leaked %zu block(s)\n", test_name,
                       allocated_blocks);
        exit_test(1);
    }
}